

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall jrtplib::RTPTCPTransmitter::Init(RTPTCPTransmitter *this,bool tsafe)

{
  int iVar1;
  
  iVar1 = -2;
  if (this->m_init != false) {
    iVar1 = -0xb6;
  }
  if (!tsafe && this->m_init == false) {
    this->m_maxPackSize = 0xffff;
    this->m_init = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPTCPTransmitter::Init(bool tsafe)
{
	if (m_init)
		return ERR_RTP_TCPTRANS_ALREADYINIT;
	
#ifdef RTP_SUPPORT_THREAD
	m_threadsafe = tsafe;
	if (m_threadsafe)
	{
		int status;
		
		status = m_mainMutex.Init();
		if (status < 0)
			return ERR_RTP_TCPTRANS_CANTINITMUTEX;
		status = m_waitMutex.Init();
		if (status < 0)
			return ERR_RTP_TCPTRANS_CANTINITMUTEX;
	}
#else
	if (tsafe)
		return ERR_RTP_NOTHREADSUPPORT;
#endif // RTP_SUPPORT_THREAD

	m_maxPackSize = RTPTCPTRANS_MAXPACKSIZE;
	m_init = true;
	return 0;
}